

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h263d_vdpu2.c
# Opt level: O2

MPP_RET hal_vpu2_h263d_start(void *hal,HalTaskInfo *task)

{
  void *pvVar1;
  MPP_RET MVar2;
  char *fmt;
  RK_U32 i;
  ulong uVar3;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  
  pvVar1 = *(void **)((long)hal + 0x88);
  if (((byte)h263d_hal_debug & 1) != 0) {
    for (uVar3 = 0; uVar3 != 0x9f; uVar3 = uVar3 + 1) {
      _mpp_log_l(4,"hal_vpu_h263d","reg[%03d]: %08x\n",(char *)0x0,uVar3 & 0xffffffff,
                 (ulong)*(uint *)((long)pvVar1 + uVar3 * 4));
    }
  }
  wr_cfg.size = 0x27c;
  wr_cfg.offset = 0;
  wr_cfg.reg = pvVar1;
  MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x70),4,&wr_cfg);
  if (MVar2 == MPP_OK) {
    rd_cfg.size = 0x27c;
    rd_cfg.offset = 0;
    rd_cfg.reg = pvVar1;
    MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x70),5,&rd_cfg);
    if (MVar2 == MPP_OK) {
      MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x70),0xf,(void *)0x0);
      if (MVar2 == MPP_OK) {
        return MPP_OK;
      }
      _mpp_log_l(2,"hal_vpu_h263d","send cmd failed %d\n","hal_vpu2_h263d_start",(ulong)(uint)MVar2)
      ;
      return MVar2;
    }
    fmt = "set register read failed %d\n";
  }
  else {
    fmt = "set register write failed %d\n";
  }
  _mpp_log_l(2,"hal_vpu_h263d",fmt,"hal_vpu2_h263d_start",(ulong)(uint)MVar2);
  return MVar2;
}

Assistant:

MPP_RET hal_vpu2_h263d_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    hal_h263_ctx *ctx = (hal_h263_ctx *)hal;
    RK_U32 *regs = (RK_U32 *)ctx->regs;

    if (h263d_hal_debug & H263D_HAL_DBG_REG_PUT) {
        RK_U32 reg_count = (sizeof(Vpu2H263dRegSet_t) / sizeof(RK_U32));
        RK_U32 i = 0;

        for (i = 0; i < reg_count; i++)
            mpp_log("reg[%03d]: %08x\n", i, regs[i]);
    }

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;

        wr_cfg.reg = regs;
        wr_cfg.size = sizeof(Vpu2H263dRegSet_t);
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = regs;
        rd_cfg.size = sizeof(Vpu2H263dRegSet_t);
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    (void)task;
    return ret;
}